

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  uint t;
  uint32_t value;
  unsigned_long t_00;
  LogMessage *pLVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_40 [19];
  Voidify local_2d;
  uint local_2c;
  unsigned_long local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  uint8_t *target_local;
  string *str_local;
  
  absl_log_internal_check_op_result = (string *)target;
  target_local = (uint8_t *)str;
  t_00 = std::__cxx11::string::size();
  local_28 = absl::lts_20240722::log_internal::GetReferenceableValue(t_00);
  t = std::numeric_limits<unsigned_int>::max();
  local_2c = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_20 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_int>
                       (&local_28,&local_2c,"str.size() <= std::numeric_limits<uint32_t>::max()");
  if (local_20 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x408,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_2d,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  value = std::__cxx11::string::size();
  absl_log_internal_check_op_result =
       (string *)WriteVarint32ToArray(value,(uint8_t *)absl_log_internal_check_op_result);
  puVar2 = WriteStringToArray((string *)target_local,(uint8_t *)absl_log_internal_check_op_result);
  return puVar2;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}